

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0,_1>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherIncr,
               long otherStride,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined8 uVar4;
  long *plVar5;
  ulong size_00;
  ulong size_01;
  LhsScalar *pLVar6;
  RhsScalar *pRVar7;
  undefined1 *puVar8;
  ulong *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  undefined1 auStack_688 [8];
  double *local_680 [3];
  long local_668;
  bool local_660;
  undefined7 uStack_65f;
  long local_658;
  double *local_650;
  double *local_648;
  long local_640;
  bool local_638;
  undefined7 uStack_637;
  long local_630;
  double *local_628;
  double *local_620;
  double local_618;
  long local_610;
  double *local_608;
  ulong local_600;
  ulong local_5f8;
  double *local_5f0;
  double *local_5e8;
  double *local_5e0;
  double *local_5d8;
  double *local_5d0;
  LhsScalar *local_5c8;
  LhsScalar *local_5c0;
  blas_data_mapper<double,_long,_0,_0,_1> local_5b8;
  const_blas_data_mapper<double,_long,_0> local_5a8;
  long local_598;
  long local_590;
  long actual_mc;
  long i2;
  long end;
  long start;
  double *local_568;
  const_blas_data_mapper<double,_long,_0> local_560;
  long local_550;
  long startTarget;
  double *local_540;
  long local_538;
  long blockBOffset;
  long startBlock;
  long lengthTarget;
  long i3;
  LinearMapper l;
  LinearMapper r;
  double b;
  double *otherij;
  long j;
  double a;
  long s;
  long rs;
  long i;
  long k;
  long local_4c0;
  long local_4b8;
  long actualPanelWidth;
  long k1;
  long local_4a0;
  long actual_cols;
  long j2;
  long local_488;
  long actual_kc;
  long k2;
  long local_470;
  ulong local_468;
  long subcols;
  ptrdiff_t l3;
  ptrdiff_t l2;
  ptrdiff_t l1;
  undefined1 local_440 [4];
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  pack_lhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_410 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeB;
  size_t sizeA;
  long local_3d8;
  long mc;
  long kc;
  OtherMapper other;
  TriMapper tri;
  long cols;
  long otherIncr_local;
  double *_other_local;
  long triStride_local;
  double *_tri_local;
  long otherSize_local;
  long size_local;
  ulong local_368;
  long local_360;
  double *local_358;
  long *local_350;
  long local_348;
  long local_340;
  double *local_338;
  long *local_330;
  double *local_328;
  long local_320;
  long *local_318;
  double *local_310;
  long local_308;
  long *local_300;
  undefined1 local_2f8 [8];
  double *local_2f0;
  long local_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long *local_2c8;
  undefined1 local_2c0 [8];
  long local_2b8;
  long *local_2b0;
  long local_2a8;
  LinearMapper *local_2a0;
  undefined8 local_298;
  long local_290;
  long *local_288;
  undefined1 local_280 [16];
  undefined8 local_270;
  double *local_268;
  double *local_260;
  undefined1 *local_258;
  undefined8 local_250;
  long local_248;
  long *local_240;
  long local_238;
  long local_230;
  long *local_228;
  undefined1 local_220 [16];
  undefined8 local_210;
  double *local_208;
  long local_200;
  undefined1 *local_1f8;
  long local_1f0;
  long local_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long *local_1c8;
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  double *local_1a8;
  long local_1a0;
  undefined1 *local_198;
  long local_190;
  long local_188;
  long *local_180;
  long local_178;
  long local_170;
  long *local_168;
  undefined1 local_160 [16];
  long local_150;
  double *local_148;
  undefined1 *local_140;
  long local_138;
  long local_130;
  long *local_128;
  undefined1 local_120 [16];
  long local_110;
  double *local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  long local_f0;
  double *local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  long local_d0;
  double *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  long local_b0;
  double *local_a8;
  long *local_a0;
  undefined8 local_98;
  double *local_90;
  undefined1 *local_88;
  long local_80;
  long local_78;
  long *local_70;
  long local_68;
  long local_60;
  long *local_58;
  long local_50;
  long local_48;
  long *local_40;
  long local_38;
  long local_30;
  long *local_28;
  undefined8 local_20;
  long local_18;
  undefined1 *local_10;
  
  puVar8 = auStack_688;
  local_350 = &other.m_stride;
  local_b8 = 1;
  local_330 = &kc;
  local_340 = otherStride;
  other.m_data = (double *)otherStride;
  otherSize_local = size;
  local_360 = triStride;
  local_358 = _tri;
  local_348 = otherIncr;
  local_338 = _other;
  local_b0 = triStride;
  local_a8 = _tri;
  local_a0 = local_350;
  kc = (long)_other;
  other.m_stride = (long)_tri;
  if (otherIncr == 1) {
    mc = level3_blocking<double,_double>::kc(blocking);
    sizeA = level3_blocking<double,_double>::mc(blocking);
    plVar5 = std::min<long>(&otherSize_local,(long *)&sizeA);
    local_3d8 = *plVar5;
    size_00 = mc * local_3d8;
    size_01 = mc * otherSize;
    local_368 = size_00;
    if (0x1fffffffffffffff < size_00) {
      throw_std_bad_alloc();
    }
    pLVar6 = level3_blocking<double,_double>::blockA(blocking);
    if (pLVar6 == (LhsScalar *)0x0) {
      if (size_00 * 8 < 0x20001) {
        lVar10 = -(size_00 * 8 + 0x1e & 0xfffffffffffffff0);
        puVar8 = auStack_688 + lVar10;
        local_5c8 = (LhsScalar *)((long)local_680 + lVar10);
      }
      else {
        local_5c8 = (LhsScalar *)aligned_malloc(size_00 * 8);
      }
      local_5c0 = local_5c8;
    }
    else {
      local_5c0 = level3_blocking<double,_double>::blockA(blocking);
      puVar8 = auStack_688;
    }
    blockA_stack_memory_destructor._16_8_ = local_5c0;
    *(undefined8 *)(puVar8 + -8) = 0x1bd6e9;
    pLVar6 = level3_blocking<double,_double>::blockA(blocking);
    if (pLVar6 == (LhsScalar *)0x0) {
      local_5d0 = (double *)blockA_stack_memory_destructor._16_8_;
    }
    else {
      local_5d0 = (double *)0x0;
    }
    pdVar3 = local_5d0;
    *(undefined8 *)(puVar8 + -8) = 0x1bd73e;
    aligned_stack_memory_handler<double>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_410,pdVar3,size_00,
               0x20000 < size_00 * 8);
    size_local = size_01;
    if (0x1fffffffffffffff < size_01) {
      *(undefined8 *)(puVar8 + -8) = 0x1bd764;
      throw_std_bad_alloc();
    }
    *(undefined8 *)(puVar8 + -8) = 0x1bd773;
    pRVar7 = level3_blocking<double,_double>::blockB(blocking);
    if (pRVar7 == (RhsScalar *)0x0) {
      if (size_01 * 8 < 0x20001) {
        puVar8 = puVar8 + -(size_01 * 8 + 0x1e & 0xfffffffffffffff0);
        local_5e0 = (double *)((ulong)(puVar8 + 0xf) & 0xfffffffffffffff0);
      }
      else {
        *(undefined8 *)(puVar8 + -8) = 0x1bd7df;
        local_5e8 = (double *)aligned_malloc(size_01 * 8);
        local_5e0 = local_5e8;
      }
      local_5d8 = local_5e0;
    }
    else {
      *(undefined8 *)(puVar8 + -8) = 0x1bd782;
      local_5d8 = level3_blocking<double,_double>::blockB(blocking);
    }
    pdVar3 = local_5d8;
    *(undefined8 *)(puVar8 + -8) = 0x1bd81d;
    pRVar7 = level3_blocking<double,_double>::blockB(blocking);
    if (pRVar7 == (RhsScalar *)0x0) {
      local_5f0 = pdVar3;
    }
    else {
      local_5f0 = (double *)0x0;
    }
    pdVar15 = local_5f0;
    *(undefined8 *)(puVar8 + -8) = 0x1bd86b;
    aligned_stack_memory_handler<double>::aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_440,pdVar15,size_01,
               0x20000 < size_01 * 8);
    *(undefined8 *)(puVar8 + -8) = 0x1bd889;
    manage_caching_sizes(GetAction,&l2,&l3,&subcols);
    if (otherSize < 1) {
      local_5f8 = 0;
    }
    else {
      local_600 = l3;
      *(undefined8 *)(puVar8 + -8) = 0x1bd8b3;
      plVar5 = std::max<long>(&otherStride,&otherSize_local);
      local_5f8 = local_600 / (ulong)(*plVar5 << 5);
    }
    local_468 = local_5f8;
    local_470 = (long)local_5f8 / 4 << 2;
    k2 = 4;
    *(undefined8 *)(puVar8 + -8) = 0x1bd925;
    puVar9 = (ulong *)std::max<long>(&local_470,&k2);
    local_468 = *puVar9;
    for (actual_kc = otherSize_local; 0 < actual_kc; actual_kc = actual_kc - mc) {
      j2 = actual_kc;
      *(undefined8 *)(puVar8 + -8) = 0x1bd96c;
      plVar5 = std::min<long>(&j2,&mc);
      local_488 = *plVar5;
      for (actual_cols = 0; actual_cols < otherSize; actual_cols = local_468 + actual_cols) {
        k1 = otherSize - actual_cols;
        *(undefined8 *)(puVar8 + -8) = 0x1bd9bd;
        plVar5 = std::min<long>(&k1,(long *)&local_468);
        local_4a0 = *plVar5;
        for (actualPanelWidth = 0; actualPanelWidth < local_488;
            actualPanelWidth = actualPanelWidth + 4) {
          local_4c0 = local_488 - actualPanelWidth;
          k = 4;
          *(undefined8 *)(puVar8 + -8) = 0x1bda19;
          plVar5 = std::min<long>(&local_4c0,&k);
          local_4b8 = *plVar5;
          for (i = 0; lVar12 = local_488, lVar11 = local_4a0, lVar10 = local_4b8, i < local_4b8;
              i = i + 1) {
            lVar10 = ((actual_kc - actualPanelWidth) - i) + -1;
            lVar11 = (local_4b8 - i) + -1;
            lVar12 = lVar10 - lVar11;
            local_28 = &other.m_stride;
            pdVar15 = (double *)(other.m_stride + (lVar10 + lVar10 * triStride) * 8);
            local_38 = lVar10;
            local_30 = lVar10;
            *(undefined8 *)(puVar8 + -8) = 0x1bdadb;
            pdVar15 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar15);
            dVar1 = *pdVar15;
            for (otherij = (double *)actual_cols; (long)otherij < actual_cols + local_4a0;
                otherij = (double *)((long)otherij + 1)) {
              local_318 = &kc;
              local_320 = lVar10;
              local_328 = otherij;
              pdVar15 = (double *)(kc + (lVar10 + (long)otherij * (long)other.m_data) * 8);
              *pdVar15 = (1.0 / dVar1) * *pdVar15;
              dVar2 = *pdVar15;
              local_300 = &kc;
              local_308 = lVar12;
              local_310 = otherij;
              local_2e0 = &kc;
              local_2e8 = lVar12;
              local_2f0 = otherij;
              local_90 = (double *)(kc + (lVar12 + (long)otherij * (long)other.m_data) * 8);
              local_88 = local_2f8;
              local_98 = 1;
              local_608 = local_90;
              l.m_data = local_90;
              local_2c8 = &other.m_stride;
              local_2d0 = lVar12;
              local_2d8 = lVar10;
              local_40 = &other.m_stride;
              local_48 = lVar12;
              local_50 = lVar10;
              local_18 = other.m_stride + (lVar12 + lVar10 * triStride) * 8;
              local_10 = local_2c0;
              local_20 = 1;
              local_610 = local_18;
              i3 = local_18;
              for (lengthTarget = 0; lengthTarget < lVar11; lengthTarget = lengthTarget + 1) {
                local_2b0 = &i3;
                local_2b8 = lengthTarget;
                pdVar15 = (double *)(i3 + lengthTarget * 8);
                local_618 = dVar2;
                *(undefined8 *)(puVar8 + -8) = 0x1bddc4;
                pdVar15 = conj_if<false>::operator()((conj_if<false> *)((long)&l1 + 7),pdVar15);
                local_2a0 = &l;
                local_2a8 = lengthTarget;
                l.m_data[lengthTarget] = -local_618 * *pdVar15 + l.m_data[lengthTarget];
              }
            }
          }
          startBlock = (local_488 - actualPanelWidth) - local_4b8;
          blockBOffset = (actual_kc - actualPanelWidth) - local_4b8;
          local_538 = startBlock;
          lVar13 = local_488 * actual_cols;
          local_620 = pdVar3 + lVar13;
          local_1c8 = &kc;
          local_1d0 = blockBOffset;
          local_1d8 = actual_cols;
          local_180 = &kc;
          local_188 = blockBOffset;
          local_190 = actual_cols;
          local_1a0 = kc + (blockBOffset + actual_cols * (long)other.m_data) * 8;
          local_198 = local_1c0;
          local_1a8 = other.m_data;
          local_1b0 = 1;
          local_630 = local_1a0;
          local_628 = other.m_data;
          startTarget = local_1a0;
          local_540 = other.m_data;
          *(long *)(puVar8 + -0x10) = startBlock;
          *(undefined8 *)(puVar8 + -0x18) = 0x1be076;
          gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
          ::operator()((gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
                        *)((long)&l1 + 4),pdVar3 + lVar13,
                       (blas_data_mapper<double,_long,_0,_0,_1> *)&startTarget,lVar10,lVar11,lVar12,
                       *(long *)(puVar8 + -0x10));
          uVar4 = blockA_stack_memory_destructor._16_8_;
          lVar11 = local_4b8;
          lVar10 = startBlock;
          if (0 < startBlock) {
            local_550 = actual_kc - local_488;
            local_638 = blockA_stack_memory_destructor.m_deallocate;
            uStack_637 = blockA_stack_memory_destructor._17_7_;
            local_128 = &other.m_stride;
            local_130 = local_550;
            local_138 = blockBOffset;
            local_70 = &other.m_stride;
            local_78 = local_550;
            local_80 = blockBOffset;
            local_108 = (double *)(other.m_stride + (local_550 + blockBOffset * triStride) * 8);
            local_100 = local_120;
            local_110 = triStride;
            local_e0 = local_120;
            local_e8 = local_108;
            local_f0 = triStride;
            local_f8 = 1;
            local_648 = local_108;
            local_640 = triStride;
            local_560.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = local_108;
            local_560.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = triStride;
            *(undefined8 *)(puVar8 + -0x10) = 0;
            *(undefined8 *)(puVar8 + -0x18) = 0x1be223;
            gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
            ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
                          *)((long)&l1 + 5),(double *)uVar4,&local_560,lVar11,lVar10,0,
                         *(long *)(puVar8 + -0x10));
            uVar4 = blockA_stack_memory_destructor._16_8_;
            lVar13 = local_488;
            lVar12 = local_4a0;
            lVar11 = local_4b8;
            lVar10 = startBlock;
            local_228 = &kc;
            local_230 = local_550;
            local_238 = actual_cols;
            local_1e0 = &kc;
            local_1e8 = local_550;
            local_1f0 = actual_cols;
            local_200 = kc + (local_550 + actual_cols * (long)other.m_data) * 8;
            local_1f8 = local_220;
            local_208 = other.m_data;
            local_210 = 1;
            local_658 = local_200;
            local_650 = other.m_data;
            start = local_200;
            local_568 = other.m_data;
            lVar14 = local_488 * actual_cols;
            *(long *)(puVar8 + -0x10) = local_538;
            *(long *)(puVar8 + -0x20) = lVar13;
            *(long *)(puVar8 + -0x28) = lVar11;
            *(long *)(puVar8 + -0x30) = lVar12;
            *(undefined8 *)(puVar8 + -0x18) = 0;
            *(undefined8 *)(puVar8 + -0x38) = 0x1be3c8;
            gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
            ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
                          *)((long)&l1 + 6),(blas_data_mapper<double,_long,_0,_0,_1> *)&start,
                         (double *)uVar4,pdVar3 + lVar14,lVar10,lVar11,*(long *)(puVar8 + -0x30),
                         -1.0,*(long *)(puVar8 + -0x28),*(long *)(puVar8 + -0x20),
                         *(long *)(puVar8 + -0x18),*(long *)(puVar8 + -0x10));
          }
        }
      }
      end = 0;
      i2 = actual_kc - mc;
      for (actual_mc = 0; actual_mc < i2; actual_mc = local_3d8 + actual_mc) {
        local_598 = i2 - actual_mc;
        *(undefined8 *)(puVar8 + -8) = 0x1be46f;
        plVar5 = std::min<long>(&local_3d8,&local_598);
        uVar4 = blockA_stack_memory_destructor._16_8_;
        lVar11 = local_488;
        lVar10 = *plVar5;
        local_590 = lVar10;
        if (0 < lVar10) {
          local_660 = blockA_stack_memory_destructor.m_deallocate;
          uStack_65f = blockA_stack_memory_destructor._17_7_;
          local_178 = actual_kc - mc;
          local_168 = &other.m_stride;
          local_170 = actual_mc;
          local_58 = &other.m_stride;
          local_60 = actual_mc;
          local_68 = local_178;
          local_148 = (double *)(other.m_stride + (actual_mc + local_178 * triStride) * 8);
          local_140 = local_160;
          local_150 = triStride;
          local_c0 = local_160;
          local_c8 = local_148;
          local_d0 = triStride;
          local_d8 = 1;
          local_680[2] = local_148;
          local_668 = triStride;
          local_5a8.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = local_148;
          local_5a8.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = triStride;
          *(undefined8 *)(puVar8 + -0x10) = 0;
          *(undefined8 *)(puVar8 + -0x18) = 0x1be612;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
          ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
                        *)((long)&l1 + 5),(double *)uVar4,&local_5a8,lVar11,lVar10,0,
                       *(long *)(puVar8 + -0x10));
          uVar4 = blockA_stack_memory_destructor._16_8_;
          lVar11 = local_488;
          lVar10 = local_590;
          local_288 = &kc;
          local_290 = actual_mc;
          local_298 = 0;
          local_240 = &kc;
          local_248 = actual_mc;
          local_250 = 0;
          local_260 = (double *)(kc + actual_mc * 8);
          local_258 = local_280;
          local_268 = other.m_data;
          local_270 = 1;
          local_680[0] = local_260;
          local_680[1] = other.m_data;
          local_5b8.m_data = local_260;
          local_5b8.m_stride = (long)other.m_data;
          *(long *)(puVar8 + -0x30) = otherSize;
          *(undefined8 *)(puVar8 + -0x10) = 0;
          *(undefined8 *)(puVar8 + -0x18) = 0;
          *(undefined8 *)(puVar8 + -0x20) = 0xffffffffffffffff;
          *(undefined8 *)(puVar8 + -0x28) = 0xffffffffffffffff;
          *(undefined8 *)(puVar8 + -0x38) = 0x1be7a0;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
          ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
                        *)((long)&l1 + 6),&local_5b8,(double *)uVar4,pdVar3,lVar10,lVar11,
                       *(long *)(puVar8 + -0x30),-1.0,*(long *)(puVar8 + -0x28),
                       *(long *)(puVar8 + -0x20),*(long *)(puVar8 + -0x18),*(long *)(puVar8 + -0x10)
                      );
        }
      }
    }
    *(undefined8 *)(puVar8 + -8) = 0x1be7ef;
    aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_440);
    *(undefined8 *)(puVar8 + -8) = 0x1be7fb;
    aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
              ((aligned_stack_memory_handler<double> *)local_410);
    return;
  }
  __assert_fail("incr==1",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/BlasUtil.h"
                ,0xae,
                "Eigen::internal::blas_data_mapper<double, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = double, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
               );
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }